

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O3

int __thiscall IndexTree::rotateTwice(IndexTree *this,int32_t *root,int direction)

{
  int iVar1;
  int iVar2;
  Node *pNVar3;
  short sVar4;
  int iVar5;
  short sVar6;
  int32_t *piVar7;
  int32_t *piVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = *root;
  pNVar3 = this->nodes;
  if (direction == 1) {
    iVar5 = pNVar3[iVar1].right;
    piVar7 = &pNVar3[iVar1].right;
    lVar9 = 0x418;
    lVar10 = 0x414;
    piVar8 = &pNVar3[iVar5].left;
  }
  else {
    if (direction != -1) goto LAB_00105a13;
    iVar5 = pNVar3[iVar1].left;
    piVar7 = &pNVar3[iVar1].left;
    lVar9 = 0x414;
    lVar10 = 0x418;
    piVar8 = &pNVar3[iVar5].right;
  }
  iVar2 = *piVar8;
  *root = iVar2;
  *piVar7 = *(int32_t *)(pNVar3[iVar2].key + lVar10);
  *piVar8 = *(int *)(pNVar3[iVar2].key + lVar9);
  *(int *)(pNVar3[iVar2].key + lVar9) = iVar5;
  *(int *)(pNVar3[iVar2].key + lVar10) = iVar1;
LAB_00105a13:
  iVar1 = *root;
  iVar5 = pNVar3[iVar1].right;
  sVar6 = (short)*(undefined4 *)&pNVar3[iVar1].balance_factor;
  if (sVar6 < 1) {
    sVar6 = 0;
  }
  pNVar3[pNVar3[iVar1].left].balance_factor = -sVar6;
  sVar4 = (short)*(undefined4 *)&pNVar3[iVar1].balance_factor;
  sVar6 = 0;
  if (sVar4 < 0) {
    sVar6 = sVar4;
  }
  pNVar3[iVar5].balance_factor = -sVar6;
  pNVar3[iVar1].balance_factor = 0;
  return 1;
}

Assistant:

int IndexTree::rotateTwice(int32_t &root, int direction) {
    auto old_root = root;
    auto &_old_root = nodes[root];
    auto old_right = _old_root.right;
    auto &_old_right = nodes[old_right];
    auto old_left = _old_root.left;
    auto &_old_left = nodes[old_left];

//    printf("Before rotate twice %d root: %d %d %d\n", direction, root, _old_root.left, _old_root.right);
//    if (_old_root.left != -1) {
//        printf("\tleft: %d %d %d\n", _old_root.left, _old_left.left, _old_left.right);
//    }
//    if (_old_root.right != -1) {
//        printf("\tright: %d %d %d\n", _old_root.right, _old_right.left, _old_right.right);
//    }
    if (direction == -1) {
        root = _old_left.right;
        auto &_new_root = nodes[root];
        // re-attach
        _old_root.left = _new_root.right;
        _old_left.right = _new_root.left;
        _new_root.left = old_left;
        _new_root.right = old_root;
    } else if (direction == 1){
        root = _old_right.left;
        auto &_new_root = nodes[root];
        // re-attach
        _old_root.right = _new_root.left;
        _old_right.left = _new_root.right;
        _new_root.right = old_right;
        _new_root.left = old_root;
    }

    auto &new_root = nodes[root];
    auto &_new_left = nodes[new_root.left];
    auto &_new_right = nodes[new_root.right];
    _new_left.balance_factor = (int16_t) -max(new_root.balance_factor, 0);
    _new_right.balance_factor = (int16_t) -min(new_root.balance_factor, 0);
    new_root.balance_factor = 0;
//
//    printf("After rotate twice: %d %d %d\n", root, new_root.left, new_root.right);
//    if (new_root.left != -1) {
//        printf("\tleft: %d %d %d\n", new_root.left, _new_left.left, _new_left.right);
//    }
//    if (new_root.right != -1) {
//        printf("\tright: %d %d %d\n", new_root.right, _new_right.left, _new_right.right);
//    }
    return 1;
}